

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O2

int Dice::roll(void)

{
  result_type_conflict rVar1;
  initializer_list<unsigned_int> __il;
  seed_seq seed;
  uniform_int_distribution<int> dist;
  mt19937 eng;
  random_device r;
  
  std::random_device::random_device(&r);
  eng._M_x[0]._0_4_ = std::random_device::_M_getval();
  eng._M_x[0]._4_4_ = std::random_device::_M_getval();
  eng._M_x[1]._0_4_ = std::random_device::_M_getval();
  eng._M_x[1]._4_4_ = std::random_device::_M_getval();
  eng._M_x[2]._0_4_ = std::random_device::_M_getval();
  eng._M_x[2]._4_4_ = std::random_device::_M_getval();
  eng._M_x[3]._0_4_ = std::random_device::_M_getval();
  eng._M_x[3]._4_4_ = std::random_device::_M_getval();
  __il._M_len = 8;
  __il._M_array = (iterator)&eng;
  std::seed_seq::seed_seq<unsigned_int,void>(&seed,__il);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed<std::seed_seq>(&eng,&seed);
  dist._M_param._M_a = 1;
  dist._M_param._M_b = 6;
  rVar1 = std::uniform_int_distribution<int>::operator()(&dist,&eng);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&seed);
  std::random_device::~random_device(&r);
  return rVar1;
}

Assistant:

int Dice::roll() {
    std::random_device r;
    std::seed_seq seed{r(), r(), r(), r(), r(), r(), r(), r()};
    std::mt19937 eng{seed};
    std::uniform_int_distribution<> dist(1, 6);

    int roll = dist(eng);

    return roll;
}